

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfRequestPub.c
# Opt level: O3

sbfRequestImpl *
sbfRequestPub_send(sbfRequestPub_conflict pub,void *data,size_t size,sbfRequestPubReplyCb replyCb,
                  void *closure)

{
  sbfRequestTree *psVar1;
  sbfRequestImpl *psVar2;
  uint uVar3;
  sbfRequestImpl *psVar4;
  sbfRequestImpl *psVar5;
  long lVar6;
  long lVar7;
  anon_struct_32_4_548b78d9_for_mTreeEntry *paVar8;
  sbfRequestImpl *psVar9;
  sbfRequestImpl *psVar10;
  sbfRequestImpl *psVar11;
  sbfRequestImpl *psVar12;
  sbfGuid *psVar13;
  
  if ((pub->mPubReady == 0) || (pub->mSubReady == 0)) {
    psVar4 = (sbfRequestImpl *)0x0;
  }
  else {
    psVar4 = (sbfRequestImpl *)sbfMemory_calloc(1,0x68);
    psVar4->mPub = pub;
    (psVar4->mRefCount).mRefCount = 1;
    psVar4->mReplyCb = replyCb;
    psVar4->mClosure = closure;
    sbfGuid_increment(&pub->mNext,1);
    psVar13 = &psVar4->mGuid;
    sbfGuid_copy(psVar13,&pub->mNext);
    psVar1 = &pub->mRequests;
    psVar5 = (pub->mRequests).rbh_root;
    if (psVar5 == (sbfRequestImpl *)0x0) {
      (psVar4->mTreeEntry).rbe_left = (sbfRequestImpl *)0x0;
      (psVar4->mTreeEntry).rbe_right = (sbfRequestImpl *)0x0;
      (psVar4->mTreeEntry).rbe_parent = (sbfRequestImpl *)0x0;
      (psVar4->mTreeEntry).rbe_color = 1;
      psVar1->rbh_root = psVar4;
      psVar5 = psVar4;
    }
    else {
      do {
        psVar9 = psVar5;
        uVar3 = sbfGuid_compare(psVar13,&psVar9->mGuid);
        if ((int)uVar3 < 0) {
          lVar7 = 0x48;
        }
        else {
          lVar7 = 0x50;
          if (uVar3 == 0) goto LAB_0010197b;
        }
        psVar5 = *(sbfRequestImpl **)((long)(psVar9->mGuid).mParts + lVar7 + -0x10);
      } while (psVar5 != (sbfRequestImpl *)0x0);
      (psVar4->mTreeEntry).rbe_parent = psVar9;
      (psVar4->mTreeEntry).rbe_left = (sbfRequestImpl *)0x0;
      (psVar4->mTreeEntry).rbe_right = (sbfRequestImpl *)0x0;
      (psVar4->mTreeEntry).rbe_color = 1;
      *(sbfRequestImpl **)((sbfRefCount *)(&psVar9->mGuid + 1) + (ulong)(~uVar3 >> 0x1f) * 2 + 6) =
           psVar4;
      psVar5 = psVar4;
      do {
        if ((psVar9->mTreeEntry).rbe_color != 1) break;
        psVar2 = (psVar9->mTreeEntry).rbe_parent;
        psVar12 = (psVar2->mTreeEntry).rbe_left;
        if (psVar9 == psVar12) {
          psVar10 = (psVar2->mTreeEntry).rbe_right;
          if ((psVar10 != (sbfRequestImpl *)0x0) && ((psVar10->mTreeEntry).rbe_color == 1)) {
            (psVar10->mTreeEntry).rbe_color = 0;
            goto LAB_001017dc;
          }
          psVar10 = (psVar9->mTreeEntry).rbe_right;
          psVar11 = psVar5;
          if (psVar10 == psVar5) {
            psVar12 = (psVar10->mTreeEntry).rbe_left;
            (psVar9->mTreeEntry).rbe_right = psVar12;
            if (psVar12 == (sbfRequestImpl *)0x0) {
              (psVar10->mTreeEntry).rbe_parent = psVar2;
              psVar12 = (psVar9->mTreeEntry).rbe_parent;
LAB_001018d1:
              paVar8 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar12->mTreeEntry).rbe_right;
              if (psVar9 == (psVar12->mTreeEntry).rbe_left) {
                paVar8 = &psVar12->mTreeEntry;
              }
            }
            else {
              (psVar12->mTreeEntry).rbe_parent = psVar9;
              psVar12 = (psVar9->mTreeEntry).rbe_parent;
              (psVar10->mTreeEntry).rbe_parent = psVar12;
              paVar8 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)psVar1;
              if (psVar12 != (sbfRequestImpl *)0x0) goto LAB_001018d1;
            }
            paVar8->rbe_left = psVar10;
            (psVar10->mTreeEntry).rbe_left = psVar9;
            (psVar9->mTreeEntry).rbe_parent = psVar10;
            psVar12 = (psVar2->mTreeEntry).rbe_left;
            psVar11 = psVar9;
            psVar9 = psVar5;
          }
          (psVar9->mTreeEntry).rbe_color = 0;
          (psVar2->mTreeEntry).rbe_color = 1;
          psVar5 = (psVar12->mTreeEntry).rbe_right;
          (psVar2->mTreeEntry).rbe_left = psVar5;
          if (psVar5 != (sbfRequestImpl *)0x0) {
            (psVar5->mTreeEntry).rbe_parent = psVar2;
          }
          psVar5 = (psVar2->mTreeEntry).rbe_parent;
          (psVar12->mTreeEntry).rbe_parent = psVar5;
          paVar8 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)psVar1;
          if (psVar5 != (sbfRequestImpl *)0x0) {
            paVar8 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar5->mTreeEntry).rbe_right;
            if (psVar2 == (psVar5->mTreeEntry).rbe_left) {
              paVar8 = &psVar5->mTreeEntry;
            }
          }
          paVar8->rbe_left = psVar12;
          (psVar12->mTreeEntry).rbe_right = psVar2;
          (psVar2->mTreeEntry).rbe_parent = psVar12;
          psVar5 = psVar11;
        }
        else if ((psVar12 == (sbfRequestImpl *)0x0) || ((psVar12->mTreeEntry).rbe_color != 1)) {
          psVar12 = (psVar9->mTreeEntry).rbe_left;
          psVar10 = psVar5;
          if (psVar12 == psVar5) {
            psVar10 = (psVar12->mTreeEntry).rbe_right;
            (psVar9->mTreeEntry).rbe_left = psVar10;
            if (psVar10 == (sbfRequestImpl *)0x0) {
              (psVar12->mTreeEntry).rbe_parent = psVar2;
              psVar10 = (psVar9->mTreeEntry).rbe_parent;
LAB_0010185b:
              paVar8 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar10->mTreeEntry).rbe_right;
              if (psVar9 == (psVar10->mTreeEntry).rbe_left) {
                paVar8 = &psVar10->mTreeEntry;
              }
            }
            else {
              (psVar10->mTreeEntry).rbe_parent = psVar9;
              psVar10 = (psVar9->mTreeEntry).rbe_parent;
              (psVar12->mTreeEntry).rbe_parent = psVar10;
              paVar8 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)psVar1;
              if (psVar10 != (sbfRequestImpl *)0x0) goto LAB_0010185b;
            }
            paVar8->rbe_left = psVar12;
            (psVar12->mTreeEntry).rbe_right = psVar9;
            (psVar9->mTreeEntry).rbe_parent = psVar12;
            psVar10 = psVar9;
            psVar9 = psVar5;
          }
          (psVar9->mTreeEntry).rbe_color = 0;
          (psVar2->mTreeEntry).rbe_color = 1;
          psVar5 = (psVar2->mTreeEntry).rbe_right;
          psVar9 = (psVar5->mTreeEntry).rbe_left;
          (psVar2->mTreeEntry).rbe_right = psVar9;
          if (psVar9 != (sbfRequestImpl *)0x0) {
            (psVar9->mTreeEntry).rbe_parent = psVar2;
          }
          psVar9 = (psVar2->mTreeEntry).rbe_parent;
          (psVar5->mTreeEntry).rbe_parent = psVar9;
          paVar8 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)psVar1;
          if (psVar9 != (sbfRequestImpl *)0x0) {
            paVar8 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar9->mTreeEntry).rbe_right;
            if (psVar2 == (psVar9->mTreeEntry).rbe_left) {
              paVar8 = &psVar9->mTreeEntry;
            }
          }
          paVar8->rbe_left = psVar5;
          (psVar5->mTreeEntry).rbe_left = psVar2;
          (psVar2->mTreeEntry).rbe_parent = psVar5;
          psVar5 = psVar10;
        }
        else {
          (psVar12->mTreeEntry).rbe_color = 0;
LAB_001017dc:
          (psVar9->mTreeEntry).rbe_color = 0;
          (psVar2->mTreeEntry).rbe_color = 1;
          psVar5 = psVar2;
        }
        psVar9 = (psVar5->mTreeEntry).rbe_parent;
      } while (psVar9 != (sbfRequestImpl *)0x0);
      psVar5 = psVar1->rbh_root;
    }
    (psVar5->mTreeEntry).rbe_color = 0;
LAB_0010197b:
    lVar6 = sbfPub_getBuffer(pub->mPub,size + 0x40);
    lVar7 = *(long *)(lVar6 + 8);
    sbfGuid_copy(lVar7,psVar13);
    *(undefined8 *)(lVar7 + 0x30) = 0;
    *(undefined8 *)(lVar7 + 0x38) = 0;
    *(undefined8 *)(lVar7 + 0x20) = 0;
    *(undefined8 *)(lVar7 + 0x28) = 0;
    memcpy((void *)(lVar7 + 0x40),data,size);
    sbfPub_sendBuffer(pub->mPub,lVar6);
  }
  return psVar4;
}

Assistant:

sbfRequest
sbfRequestPub_send (sbfRequestPub pub,
                    void* data,
                    size_t size,
                    sbfRequestPubReplyCb replyCb,
                    void* closure)
{
    sbfRequest        req;
    sbfBuffer         buffer;
    sbfRequestHeader* hdr;

    if (!pub->mPubReady || !pub->mSubReady)
        return NULL;

    req = xcalloc (1, sizeof *req);
    req->mPub = pub;
    sbfRefCount_init (&req->mRefCount, 1);

    req->mReplyCb = replyCb;
    req->mClosure = closure;

    sbfGuid_increment (&pub->mNext, 1);
    sbfGuid_copy (&req->mGuid, &pub->mNext);

    RB_INSERT (sbfRequestTreeImpl, &pub->mRequests, req);

    buffer = sbfPub_getBuffer (pub->mPub, size + sizeof *hdr);

    hdr = sbfBuffer_getData (buffer);
    sbfGuid_copy (&hdr->mGuid, &req->mGuid);
    memset (hdr->mSpace, 0, sizeof hdr->mSpace);

    memcpy (hdr + 1, data, size);
    sbfPub_sendBuffer (pub->mPub, buffer);

    return req;
}